

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall fw::Texture::Texture(Texture *this,istream *stream,string *filepath)

{
  int iVar1;
  Writer *pWVar2;
  float *image;
  stbi_uc *image_00;
  int *comp;
  int height;
  int width;
  int components;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  Writer local_98;
  
  this->_vptr_Texture = (_func_int **)&PTR__Texture_001eac78;
  std::__cxx11::string::string((string *)&this->_filepath,(string *)filepath);
  loadStream(&buffer,stream);
  iVar1 = stbi_is_hdr_from_memory
                    (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (int)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                     (int)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  stbi_set_flip_vertically_on_load(1);
  if (iVar1 == 0) {
    image_00 = stbi_load_from_memory
                         (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (int)buffer.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                          (int)buffer.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,&width,&height,&components,0
                         );
    loadTextureLDR(this,image_00,width,height,components);
    stbi_image_free(image_00);
  }
  else {
    local_98._vptr_Writer = (_func_int **)&PTR__Writer_001ea4f0;
    local_98.m_level = Info;
    local_98.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Texture.cpp"
    ;
    local_98.m_line = 0x23;
    local_98.m_func = "fw::Texture::Texture(std::istream &, const std::string &)";
    local_98.m_verboseLevel = 0;
    local_98.m_logger = (Logger *)0x0;
    local_98.m_proceed = false;
    local_98.m_messageBuilder.m_logger = (Logger *)0x0;
    local_98.m_messageBuilder.m_containerLogSeperator = "";
    local_98.m_dispatchAction = NormalLog;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_98,1,"framework");
    pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [9])"Texture ");
    pWVar2 = el::base::Writer::operator<<(pWVar2,filepath);
    el::base::Writer::operator<<(pWVar2,(char (*) [24])" is high dynamic range.");
    el::base::Writer::~Writer(&local_98);
    comp = &components;
    image = stbi_loadf_from_memory
                      (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (int)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                       (int)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start,&width,&height,comp,0);
    loadTextureHDR(this,image,width,height,(int)comp);
    stbi_image_free(image);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

Texture::Texture(
    std::istream& stream,
    const std::string& filepath
):
    _filepath{filepath}
{
    auto buffer = loadStream(stream);
    bool isHDR = stbi_is_hdr_from_memory(buffer.data(), buffer.size());

    stbi_set_flip_vertically_on_load(true);
    int width, height, components;

    if (isHDR)
    {
        LOG(INFO) << "Texture " << filepath << " is high dynamic range.";

        auto image = stbi_loadf_from_memory(
            buffer.data(), buffer.size(), &width, &height, &components, 0
        );

        loadTextureHDR(image, width, height, components);
        stbi_image_free(image);
    }
    else
    {
        auto image = stbi_load_from_memory(
            buffer.data(), buffer.size(), &width, &height, &components, 0
        );

        loadTextureLDR(image, width, height, components);
        stbi_image_free(image);
    }
}